

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecvt.cpp
# Opt level: O1

void __thiscall
booster::locale::impl_icu::uconv_converter::uconv_converter(uconv_converter *this,string *encoding)

{
  pointer pcVar1;
  char cVar2;
  UConverter *pUVar3;
  invalid_charset_error *this_00;
  UErrorCode err;
  int local_54;
  string local_50;
  
  (this->super_base_converter)._vptr_base_converter = (_func_int **)&PTR__uconv_converter_001d1c80;
  (this->encoding_)._M_dataplus._M_p = (pointer)&(this->encoding_).field_2;
  pcVar1 = (encoding->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->encoding_,pcVar1,pcVar1 + encoding->_M_string_length);
  local_54 = 0;
  pUVar3 = (UConverter *)ucnv_open_70((encoding->_M_dataplus)._M_p);
  this->cvt_ = pUVar3;
  ucnv_setFromUCallBack_70(pUVar3,UCNV_FROM_U_CALLBACK_STOP_70,0,0,0,&local_54);
  ucnv_setToUCallBack_70(this->cvt_,UCNV_TO_U_CALLBACK_STOP_70,0,0,0,&local_54);
  if (this->cvt_ != (UConverter *)0x0) {
    if (local_54 < 1) {
      cVar2 = ucnv_getMaxCharSize_70();
      this->max_len_ = (int)cVar2;
      return;
    }
    if (this->cvt_ != (UConverter *)0x0) {
      ucnv_close_70();
    }
  }
  this_00 = (invalid_charset_error *)__cxa_allocate_exception(0x30);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar1 = (encoding->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + encoding->_M_string_length);
  conv::invalid_charset_error::invalid_charset_error(this_00,&local_50);
  __cxa_throw(this_00,&conv::invalid_charset_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

uconv_converter(std::string const &encoding) :
            encoding_(encoding)
        {
            UErrorCode err=U_ZERO_ERROR;
            
            // No need to check err each time, this
            // is how ICU works.
            cvt_ = ucnv_open(encoding.c_str(),&err);
            ucnv_setFromUCallBack(cvt_,UCNV_FROM_U_CALLBACK_STOP,0,0,0,&err);
            ucnv_setToUCallBack(cvt_,UCNV_TO_U_CALLBACK_STOP,0,0,0,&err);

            if(!cvt_ || U_FAILURE(err)) {
                if(cvt_)
                    ucnv_close(cvt_);
                throw conv::invalid_charset_error(encoding);
            }
            
            max_len_ = ucnv_getMaxCharSize(cvt_);
        }